

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetCollectLinkLanguages::~cmTargetCollectLinkLanguages(cmTargetCollectLinkLanguages *this)

{
  cmTargetCollectLinkLanguages *this_local;
  
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::~set
            (&this->Visited);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmTargetCollectLinkLanguages(cmTarget const* target,
                               const std::string& config,
                               UNORDERED_SET<std::string>& languages,
                               cmTarget const* head):
    Config(config), Languages(languages), HeadTarget(head),
    Makefile(target->GetMakefile()), Target(target)
  { this->Visited.insert(target); }